

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_157::Directize::run(Directize *this,Module *module)

{
  pointer puVar1;
  Table *__k;
  pointer puVar2;
  Export *pEVar3;
  undefined1 __p [8];
  bool bVar4;
  mapped_type *pmVar5;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  pointer puVar6;
  pointer puVar7;
  variant<wasm::Name,_wasm::HeapType> *__k_00;
  _Base_ptr p_Var8;
  undefined1 auStack_228 [8];
  Name name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [3];
  bool local_1d8;
  pointer local_1d0;
  pointer puStack_1c8;
  pointer local_120;
  pointer pbStack_118;
  pointer local_110;
  _Alloc_hider _Stack_108;
  Module *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e0 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_80 [8];
  TableInfoMap tables;
  anon_class_8_1_6c9b2fa3 canOptimize;
  
  if ((module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_228,"directize-initial-contents-immutable",
               (allocator<char> *)local_80);
    bVar4 = Pass::hasArgument(&this->super_Pass,(string *)auStack_228);
    std::__cxx11::string::~string((string *)auStack_228);
    local_80 = (undefined1  [8])&tables._M_h._M_rehash_policy._M_next_resize;
    tables._M_h._M_buckets = (__buckets_ptr)0x1;
    tables._M_h._M_bucket_count = 0;
    tables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    tables._M_h._M_element_count._0_4_ = 0x3f800000;
    tables._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    tables._M_h._M_rehash_policy._4_4_ = 0;
    tables._M_h._M_rehash_policy._M_next_resize = 0;
    puVar1 = (module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (module->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      pmVar5 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)local_80,
                            (key_type *)
                            (puVar6->_M_t).
                            super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
      pmVar5->initialContentsImmutable = bVar4;
      std::make_unique<wasm::TableUtils::FlatTable,wasm::Module&,wasm::Table&>
                ((Module *)auStack_228,(Table *)module);
      pmVar5 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)local_80,
                            (key_type *)
                            (puVar6->_M_t).
                            super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
      __p = auStack_228;
      auStack_228 = (undefined1  [8])0x0;
      std::
      __uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
      ::reset((__uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
               *)&pmVar5->flatTable,(pointer)__p);
      std::
      unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>::
      ~unique_ptr((unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
                   *)auStack_228);
    }
    puVar1 = (module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (module->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      __k = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (*(char **)((long)&(__k->super_Importable).module + 8) != (char *)0x0) {
        pmVar5 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)local_80,(key_type *)__k);
        pmVar5->mayBeModified = true;
      }
    }
    puVar2 = (module->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (module->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
    {
      pEVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar3->kind == Table) {
        if (*(__index_type *)
             ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          __k_00 = &pEVar3->value;
        }
        else {
          __k_00 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar5 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)local_80,(key_type *)__k_00);
        pmVar5->mayBeModified = true;
      }
    }
    tables._M_h._M_single_bucket = (__node_base_ptr)local_80;
    bVar4 = run::anon_class_8_1_6c9b2fa3::operator()
                      ((anon_class_8_1_6c9b2fa3 *)&tables._M_h._M_single_bucket);
    if (bVar4) {
      analysis._48_8_ = 0;
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
      ::ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_e0,module,(Func *)&analysis.field_0x30);
      std::_Function_base::~_Function_base((_Function_base *)&analysis.field_0x30);
      for (; (undefined1 *)analysis._24_8_ != &analysis.field_0x8;
          analysis._24_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)analysis._24_8_)) {
        p_Var8 = (_Base_ptr)&((_Rb_tree_node_base *)(analysis._24_8_ + 0x20))->_M_right;
        while (p_Var8 = *(_Base_ptr *)p_Var8, p_Var8 != (_Base_ptr)0x0) {
          auStack_228 = (undefined1  [8])p_Var8->_M_parent;
          name.super_IString.str._M_len = (size_t)p_Var8->_M_left;
          pmVar5 = std::
                   unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                 *)local_80,(key_type *)auStack_228);
          pmVar5->mayBeModified = true;
        }
      }
      bVar4 = run::anon_class_8_1_6c9b2fa3::operator()
                        ((anon_class_8_1_6c9b2fa3 *)&tables._M_h._M_single_bucket);
      if (bVar4) {
        name.super_IString.str._M_str = (char *)local_208;
        name.super_IString.str._M_len = 0;
        local_208[0]._M_local_buf[0] = '\0';
        local_1d8 = false;
        local_1d0 = (pointer)0x0;
        puStack_1c8 = (pointer)0x0;
        local_120 = (pointer)0x0;
        pbStack_118 = (pointer)0x0;
        local_110 = (pointer)0x0;
        _Stack_108._M_p = (pointer)0x0;
        local_100 = (Module *)0x0;
        auStack_228 = (undefined1  [8])&PTR__WalkerPass_01120880;
        local_f8._M_local_buf[8] = '\0';
        local_f8._M_allocated_capacity =
             (size_type)
             (unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
              *)local_80;
        Pass::setPassRunner((Pass *)auStack_228,(this->super_Pass).runner);
        (*(code *)*(_Base_ptr *)((long)auStack_228 + 0x10))((Pass *)auStack_228,module);
        WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
        ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
                       *)auStack_228);
      }
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                   *)&analysis);
    }
    std::
    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                      *)local_80);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->tables.empty()) {
      return;
    }

    // TODO: consider a per-table option here
    auto initialContentsImmutable =
      hasArgument("directize-initial-contents-immutable");

    // Set up the initial info.
    TableInfoMap tables;
    for (auto& table : module->tables) {
      tables[table->name].initialContentsImmutable = initialContentsImmutable;
      tables[table->name].flatTable =
        std::make_unique<TableUtils::FlatTable>(*module, *table);
    }

    // Next, look at the imports and exports.

    for (auto& table : module->tables) {
      if (table->imported()) {
        tables[table->name].mayBeModified = true;
      }
    }

    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Table) {
        tables[*ex->getInternalName()].mayBeModified = true;
      }
    }

    // This may already be enough information to know that we can't optimize
    // anything. If so, skip scanning all the module contents.
    auto canOptimize = [&]() {
      for (auto& [_, info] : tables) {
        if (info.canOptimize()) {
          return true;
        }
      }
      return false;
    };

    if (!canOptimize()) {
      return;
    }

    // Find which tables have sets.

    using TablesWithSet = std::unordered_set<Name>;

    ModuleUtils::ParallelFunctionAnalysis<TablesWithSet> analysis(
      *module, [&](Function* func, TablesWithSet& tablesWithSet) {
        if (func->imported()) {
          return;
        }

        struct Finder : public PostWalker<Finder> {
          TablesWithSet& tablesWithSet;

          Finder(TablesWithSet& tablesWithSet) : tablesWithSet(tablesWithSet) {}

          void visitTableSet(TableSet* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableFill(TableFill* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableCopy(TableCopy* curr) {
            tablesWithSet.insert(curr->destTable);
          }
          void visitTableInit(TableInit* curr) {
            tablesWithSet.insert(curr->table);
          }
        };

        Finder(tablesWithSet).walkFunction(func);
      });

    for (auto& [_, names] : analysis.map) {
      for (auto name : names) {
        tables[name].mayBeModified = true;
      }
    }

    // Perhaps the new information about tables with sets shows we cannot
    // optimize.
    if (!canOptimize()) {
      return;
    }

    // We can optimize!
    FunctionDirectizer(tables).run(getPassRunner(), module);
  }